

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopySuffix(CordRepBtree *this,size_t offset)

{
  RefcountAndFlags *pRVar1;
  ulong uVar2;
  CordRep *pCVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  uint uVar6;
  size_t offset_00;
  ulong new_length;
  CordRepBtree *pCVar7;
  size_t sVar8;
  size_t n;
  Position PVar9;
  CopyResult CVar10;
  uint local_3c;
  
  uVar2 = (this->super_CordRep).length;
  new_length = uVar2 - offset;
  if (uVar2 < offset || new_length == 0) {
    __assert_fail("offset < this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,700,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
  }
  uVar6 = (uint)(this->super_CordRep).storage[0];
  while( true ) {
    pCVar3 = *(CordRep **)
              ((this->super_CordRep).storage + (ulong)(this->super_CordRep).storage[2] * 8 + -5);
    sVar8 = pCVar3->length - new_length;
    if (pCVar3->length < new_length) break;
    if ((int)uVar6 < 1) {
      LOCK();
      (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      pCVar5 = (CordRepBtree *)cord_internal::anon_unknown_0::MakeSubstring(pCVar3,sVar8);
      uVar6 = 0xffffffff;
      goto LAB_003dfba3;
    }
    uVar6 = uVar6 - 1;
    this = CordRep::btree(pCVar3);
    offset = sVar8;
  }
  if (offset == 0) {
    LOCK();
    pRVar1 = &(this->super_CordRep).refcount;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + 2;
    UNLOCK();
    pCVar5 = this;
  }
  else {
    PVar9 = IndexBeyond(this,offset);
    pCVar5 = CopyToEndFrom(this,PVar9.index,new_length);
    pCVar7 = pCVar5;
    local_3c = uVar6;
    while( true ) {
      n = PVar9.n;
      sVar8 = PVar9.index;
      if (n == 0) break;
      if (sVar8 == 0) {
        __assert_fail("pos.index >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x2de,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
      }
      (pCVar7->super_CordRep).storage[1] = (uint8_t)(sVar8 - 1);
      pCVar3 = Edge(this,sVar8 - 1);
      offset_00 = pCVar3->length - n;
      if ((int)local_3c < 1) {
        LOCK();
        (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        pCVar3 = cord_internal::anon_unknown_0::MakeSubstring(pCVar3,offset_00,n);
        *(CordRep **)((pCVar7->super_CordRep).storage + sVar8 * 8 + -5) = pCVar3;
        goto LAB_003dfba3;
      }
      local_3c = local_3c - 1;
      this = CordRep::btree(pCVar3);
      PVar9 = IndexBeyond(this,offset_00);
      pCVar4 = CopyToEndFrom(this,PVar9.index,n);
      *(CordRepBtree **)((pCVar7->super_CordRep).storage + sVar8 * 8 + -5) = pCVar4;
      pCVar7 = pCVar4;
    }
    (pCVar7->super_CordRep).storage[1] = (uint8_t)PVar9.index;
  }
LAB_003dfba3:
  CVar10.height = uVar6;
  CVar10.edge = &pCVar5->super_CordRep;
  CVar10._12_4_ = 0;
  return CVar10;
}

Assistant:

CopyResult CordRepBtree::CopySuffix(size_t offset) {
  assert(offset < this->length);

  // As long as `offset` starts inside the last edge, we can 'drop' the current
  // depth. For the most extreme example: if offset references the last data
  // edge in the tree, there is only a single edge / path from the top of the
  // tree to that last edge, so we can drop all the nodes except that edge.
  // The fast path check for this is `back->length >= length - offset`.
  int height = this->height();
  CordRepBtree* node = this;
  size_t len = node->length - offset;
  CordRep* back = node->Edge(kBack);
  while (back->length >= len) {
    offset = back->length - len;
    if (--height < 0) {
      return {MakeSubstring(CordRep::Ref(back), offset), height};
    }
    node = back->btree();
    back = node->Edge(kBack);
  }
  if (offset == 0) return {CordRep::Ref(node), height};

  // Offset does not point into the last edge, so we span at least two edges.
  // Find the index of offset with `IndexBeyond` which provides us the edge
  // 'beyond' the offset if offset is not a clean starting point of an edge.
  Position pos = node->IndexBeyond(offset);
  CordRepBtree* sub = node->CopyToEndFrom(pos.index, len);
  const CopyResult result = {sub, height};

  // `pos.n` contains a non zero value if the offset is not an exact starting
  // point of an edge. In this case, `pos.n` contains the 'trailing' amount of
  // bytes of the edge preceding that in `pos.index`. We need to iteratively
  // adjust the preceding edge with the 'broken' offset until we have a perfect
  // start of the edge.
  while (pos.n != 0) {
    assert(pos.index >= 1);
    const size_t begin = pos.index - 1;
    sub->set_begin(begin);
    CordRep* const edge = node->Edge(begin);

    len = pos.n;
    offset = edge->length - len;

    if (--height < 0) {
      sub->edges_[begin] = MakeSubstring(CordRep::Ref(edge), offset, len);
      return result;
    }

    node = edge->btree();
    pos = node->IndexBeyond(offset);

    CordRepBtree* nsub = node->CopyToEndFrom(pos.index, len);
    sub->edges_[begin] = nsub;
    sub = nsub;
  }
  sub->set_begin(pos.index);
  return result;
}